

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O0

bool __thiscall
Rml::DataViews::Update(DataViews *this,DataModel *model,DirtyVariables *dirty_variables)

{
  DataView *pDVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  reference __args;
  iterator iVar8;
  iterator iVar9;
  reference ppDVar10;
  pointer ppVar11;
  pointer pDVar12;
  bool bVar13;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>_>
  pVar14;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
  local_1b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
  local_1b0;
  iterator it_1;
  unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *view_2;
  iterator __end3_1;
  iterator __begin3_1;
  DataViewList *__range3_1;
  DataView *view_1;
  iterator __end2_1;
  iterator __begin2_1;
  Vector<DataView_*> *__range2_1;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  local_148;
  const_iterator local_140;
  const_iterator local_138;
  DataView **local_130;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  local_128;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  local_120;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  it_remove;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
  local_108;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>_>
  pair;
  String *variable_name_1;
  const_iterator __end2;
  const_iterator __begin2;
  DirtyVariables *__range2;
  pointer local_c8;
  reference local_c0;
  String *variable_name;
  iterator __end4;
  iterator __begin4;
  StringList *__range4;
  reference local_80;
  unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *view;
  iterator __end3;
  iterator __begin3;
  DataViewList *__range3;
  undefined1 local_50 [8];
  Vector<DataView_*> dirty_views;
  size_type sStack_30;
  int i;
  size_t num_dirty_variables_prev;
  bool result;
  DirtyVariables *dirty_variables_local;
  DataModel *model_local;
  DataViews *this_local;
  
  bVar13 = false;
  sStack_30 = 0;
  dirty_views.super__Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  do {
    if ((dirty_views.super__Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ == 0) ||
       (bVar3 = ::std::
                vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                ::empty(&this->views_to_add), !bVar3)) {
LAB_005104ec:
      bVar3 = dirty_views.super__Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 10;
    }
    else {
      sVar5 = itlib::
              flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(dirty_variables);
      bVar3 = false;
      if (sStack_30 != sVar5) goto LAB_005104ec;
    }
    if (!bVar3) {
      return bVar13;
    }
    sStack_30 = itlib::
                flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size(dirty_variables);
    ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::vector
              ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    bVar3 = ::std::
            vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
            ::empty(&this->views_to_add);
    if (!bVar3) {
      sVar6 = ::std::
              vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ::size(&this->views);
      sVar7 = ::std::
              vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ::size(&this->views_to_add);
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::reserve(&this->views,sVar6 + sVar7);
      __end3 = ::std::
               vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
               ::begin(&this->views_to_add);
      view = (unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *)
             ::std::
             vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ::end(&this->views_to_add);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_*,_std::vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>_>
                                         *)&view), bVar3) {
        local_80 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_*,_std::vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>_>
                   ::operator*(&__end3);
        __range4 = (StringList *)
                   ::std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>::get(local_80);
        ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::push_back
                  ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50,
                   (value_type *)&__range4);
        pDVar12 = ::std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>::operator->
                            (local_80);
        (*(pDVar12->super_Releasable)._vptr_Releasable[5])(&__begin4);
        __end4 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin4);
        variable_name =
             (String *)
             ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin4);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&variable_name), bVar3) {
          __args = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end4);
          local_c0 = __args;
          local_c8 = ::std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>::get(local_80);
          ::std::
          unordered_multimap<std::__cxx11::string,Rml::DataView*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>>
          ::emplace<std::__cxx11::string_const&,Rml::DataView*>
                    ((unordered_multimap<std::__cxx11::string,Rml::DataView*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>>
                      *)&this->name_view_map,__args,&local_c8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin4);
        ::std::
        vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
        ::push_back(&this->views,local_80);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_*,_std::vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>_>
        ::operator++(&__end3);
      }
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::clear(&this->views_to_add);
    }
    __end2 = itlib::
             flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(dirty_variables);
    variable_name_1 =
         (String *)
         itlib::
         flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(dirty_variables);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&variable_name_1), bVar3) {
      pair.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                 )__gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      pVar14 = ::std::
               unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>_>
               ::equal_range(&this->name_view_map,
                             (key_type *)
                             pair.second.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                             ._M_cur);
      it = pVar14.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
           ._M_cur;
      while( true ) {
        pair.first = pVar14.second.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                     ._M_cur;
        local_108._M_cur =
             (__node_type *)
             pVar14.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
             ._M_cur;
        bVar3 = ::std::__detail::operator!=
                          (&local_108,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                            *)&pair);
        if (!bVar3) break;
        ppVar11 = ::std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                                *)&local_108);
        ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::push_back
                  ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50,
                   &ppVar11->second);
        ::std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                      *)&local_108);
        pVar14.second =
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
              )(_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                )pair.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                 ._M_cur;
        pVar14.first.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                   )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                     )local_108._M_cur;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    iVar8 = ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::begin
                      ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    it_remove._M_current =
         (DataView **)
         ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::end
                   ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    ::std::
    sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>>
              ((__normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
                )iVar8._M_current,it_remove);
    local_128._M_current =
         (DataView **)
         ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::begin
                   ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    local_130 = (DataView **)
                ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::end
                          ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    local_120 = ::std::
                unique<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>>
                          (local_128,
                           (__normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
                            )local_130);
    __gnu_cxx::
    __normal_iterator<Rml::DataView*const*,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>
    ::__normal_iterator<Rml::DataView**>
              ((__normal_iterator<Rml::DataView*const*,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>
                *)&local_138,&local_120);
    local_148._M_current =
         (DataView **)
         ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::end
                   ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    __gnu_cxx::
    __normal_iterator<Rml::DataView*const*,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>
    ::__normal_iterator<Rml::DataView**>
              ((__normal_iterator<Rml::DataView*const*,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>
                *)&local_140,&local_148);
    ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::erase
              ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50,local_138,
               local_140);
    iVar8 = ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::begin
                      ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    iVar9 = ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::end
                      ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    ::std::
    sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>
              (iVar8._M_current,iVar9._M_current);
    __end2_1 = ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::begin
                         ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    view_1 = (DataView *)
             ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::end
                       ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
                               *)&view_1), bVar3) {
      ppDVar10 = __gnu_cxx::
                 __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
                 ::operator*(&__end2_1);
      pDVar1 = *ppDVar10;
      if ((pDVar1 == (DataView *)0x0) &&
         (bVar3 = Assert("RMLUI_ASSERT(view)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataView.cpp"
                         ,0x88), !bVar3)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if ((pDVar1 != (DataView *)0x0) && (bVar3 = DataView::IsValid(pDVar1), bVar3)) {
        uVar4 = (*(pDVar1->super_Releasable)._vptr_Releasable[4])(pDVar1,model);
        bVar13 = bVar13 != false || (uVar4 & 1) != 0;
      }
      __gnu_cxx::
      __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
      ::operator++(&__end2_1);
    }
    bVar3 = ::std::
            vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
            ::empty(&this->views_to_remove);
    if (!bVar3) {
      __end3_1 = ::std::
                 vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                 ::begin(&this->views_to_remove);
      view_2 = (unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *)
               ::std::
               vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
               ::end(&this->views_to_remove);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_*,_std::vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>_>
                                 *)&view_2), bVar3) {
        it_1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                   )__gnu_cxx::
                    __normal_iterator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_*,_std::vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>_>
                    ::operator*(&__end3_1);
        local_1b0._M_cur =
             (__node_type *)
             ::std::
             unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>_>
             ::begin(&this->name_view_map);
        while( true ) {
          local_1b8._M_cur =
               (__node_type *)
               ::std::
               unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>_>
               ::end(&this->name_view_map);
          bVar3 = ::std::__detail::operator!=(&local_1b0,&local_1b8);
          if (!bVar3) break;
          ppVar11 = ::std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                                  *)&local_1b0);
          pDVar1 = ppVar11->second;
          pDVar12 = ::std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>::get
                              ((unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *)
                               it_1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                               ._M_cur);
          if (pDVar1 == pDVar12) {
            local_1b0._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>_>
                 ::erase(&this->name_view_map,local_1b0._M_cur);
          }
          else {
            ::std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
            ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
                          *)&local_1b0);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_*,_std::vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>_>
        ::operator++(&__end3_1);
      }
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::clear(&this->views_to_remove);
    }
    ::std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>::~vector
              ((vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_> *)local_50);
    dirty_views.super__Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         dirty_views.super__Vector_base<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

bool DataViews::Update(DataModel& model, const DirtyVariables& dirty_variables)
{
	bool result = false;
	size_t num_dirty_variables_prev = 0;

	// View updates may result in newly added views, or even new dirty variables. Thus, we do the
	// update recursively but with an upper limit. Without the loop, newly added views won't be
	// updated until the next Update() call.
	for (int i = 0; (i == 0 || !views_to_add.empty() || num_dirty_variables_prev != dirty_variables.size()) && i < 10; i++)
	{
		num_dirty_variables_prev = dirty_variables.size();

		Vector<DataView*> dirty_views;

		if (!views_to_add.empty())
		{
			views.reserve(views.size() + views_to_add.size());
			for (auto&& view : views_to_add)
			{
				dirty_views.push_back(view.get());
				for (const String& variable_name : view->GetVariableNameList())
					name_view_map.emplace(variable_name, view.get());

				views.push_back(std::move(view));
			}
			views_to_add.clear();
		}

		for (const String& variable_name : dirty_variables)
		{
			auto pair = name_view_map.equal_range(variable_name);
			for (auto it = pair.first; it != pair.second; ++it)
				dirty_views.push_back(it->second);
		}

		// Remove duplicate entries
		std::sort(dirty_views.begin(), dirty_views.end());
		auto it_remove = std::unique(dirty_views.begin(), dirty_views.end());
		dirty_views.erase(it_remove, dirty_views.end());

		// Sort by the element's depth in the document tree so that any structural changes due to a changed variable are reflected in the element's
		// children. Eg. the 'data-for' view will remove children if any of its data variable array size is reduced.
		std::sort(dirty_views.begin(), dirty_views.end(), [](auto&& left, auto&& right) { return left->GetSortOrder() < right->GetSortOrder(); });

		for (DataView* view : dirty_views)
		{
			RMLUI_ASSERT(view);
			if (!view)
				continue;

			if (view->IsValid())
				result |= view->Update(model);
		}

		// Destroy views marked for destruction
		// @performance: Horrible...
		if (!views_to_remove.empty())
		{
			for (const auto& view : views_to_remove)
			{
				for (auto it = name_view_map.begin(); it != name_view_map.end();)
				{
					if (it->second == view.get())
						it = name_view_map.erase(it);
					else
						++it;
				}
			}

			views_to_remove.clear();
		}
	}

	return result;
}